

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O2

void getLpColBounds(HighsLp *lp,HighsInt from_col,HighsInt to_col,double *XcolLower,
                   double *XcolUpper)

{
  pointer pdVar1;
  pointer pdVar2;
  long lVar3;
  long lVar4;
  
  if (from_col <= to_col) {
    lVar3 = (long)from_col;
    pdVar1 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar4 = 0; lVar3 + lVar4 <= (long)to_col; lVar4 = lVar4 + 1) {
      if (XcolLower != (double *)0x0) {
        XcolLower[lVar4] = pdVar1[lVar3 + lVar4];
      }
      if (XcolUpper != (double *)0x0) {
        XcolUpper[lVar4] = pdVar2[lVar3 + lVar4];
      }
    }
  }
  return;
}

Assistant:

void getLpColBounds(const HighsLp& lp, const HighsInt from_col,
                    const HighsInt to_col, double* XcolLower,
                    double* XcolUpper) {
  assert(0 <= from_col && from_col < lp.num_col_);
  assert(0 <= to_col && to_col < lp.num_col_);
  if (from_col > to_col) return;
  for (HighsInt col = from_col; col < to_col + 1; col++) {
    if (XcolLower != nullptr) XcolLower[col - from_col] = lp.col_lower_[col];
    if (XcolUpper != nullptr) XcolUpper[col - from_col] = lp.col_upper_[col];
  }
}